

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

V3f Imf_2_5::anon_unknown_22::ywFromHeader(Header *header)

{
  bool bVar1;
  Chromaticities *in_RDI;
  V3f VVar2;
  Chromaticities *in_stack_00000008;
  Chromaticities cr;
  Chromaticities *in_stack_ffffffffffffff98;
  Chromaticities *blue;
  Vec2<float> in_stack_ffffffffffffffb0;
  Vec2<float> in_stack_ffffffffffffffb8;
  Vec2<float> in_stack_ffffffffffffffc0;
  Vec2<float> local_38 [7];
  
  blue = in_RDI;
  Imath_2_5::Vec2<float>::Vec2(local_38,0.64,0.33);
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffffc0,0.3,0.6);
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffffb8,0.15,0.06);
  Imath_2_5::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffffb0,0.3127,0.329);
  Chromaticities::Chromaticities
            ((Chromaticities *)in_stack_ffffffffffffffc0,(V2f *)in_stack_ffffffffffffffb8,
             (V2f *)in_stack_ffffffffffffffb0,&blue->red,&in_RDI->red);
  bVar1 = hasChromaticities((Header *)0x2b559b);
  if (bVar1) {
    chromaticities((Header *)0x2b55ab);
    Chromaticities::operator=(in_RDI,in_stack_ffffffffffffff98);
  }
  VVar2 = RgbaYca::computeYw(in_stack_00000008);
  return VVar2;
}

Assistant:

V3f
ywFromHeader (const Header &header)
{
    Chromaticities cr;

    if (hasChromaticities (header))
	cr = chromaticities (header);

    return computeYw (cr);
}